

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O2

exception_ptr test_parse_fails(char *text)

{
  char *in_RSI;
  wstring_view text_00;
  undefined1 *local_38;
  wchar_t *local_30;
  undefined1 local_28 [16];
  
  strlen(in_RSI);
  local_38 = local_28;
  std::__cxx11::wstring::_M_construct<char_const*>((wstring *)&local_38);
  text_00._M_str = local_30;
  text_00._M_len = (size_t)text;
  test_parse_fails(text_00);
  std::__cxx11::wstring::~wstring((wstring *)&local_38);
  return (exception_ptr)text;
}

Assistant:

auto test_parse_fails(const char* text) {
    return test_parse_fails(std::wstring{text, text+std::strlen(text)});
}